

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlCleanupCharEncodingHandlers(void)

{
  int test_ret;
  
  xmlCleanupCharEncodingHandlers();
  call_tests = call_tests + 1;
  xmlResetLastError();
  function_tests = function_tests + 1;
  return 0;
}

Assistant:

static int
test_xmlCleanupCharEncodingHandlers(void) {
    int test_ret = 0;



        xmlCleanupCharEncodingHandlers();
        call_tests++;
        xmlResetLastError();
    function_tests++;

    return(test_ret);
}